

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

DescriptorPoolWrapper * __thiscall
Diligent::DescriptorPoolManager::GetPool
          (DescriptorPoolWrapper *__return_storage_ptr__,DescriptorPoolManager *this,char *DebugName
          )

{
  _Elt_pointer pVVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar4 == 0) {
    LOCK();
    (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i =
         (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pVVar1 = (this->m_Pools).
             super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_Pools).
        super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == pVVar1) {
      CreateDescriptorPool(__return_storage_ptr__,this,DebugName);
    }
    else {
      peVar2 = (this->m_DeviceVkImpl->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (__return_storage_ptr__->m_pLogicalDevice).
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pVVar1->m_pLogicalDevice).
               super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (__return_storage_ptr__->m_pLogicalDevice).
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (pVVar1->m_pLogicalDevice).
               super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (pVVar1->m_pLogicalDevice).
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->m_pLogicalDevice).
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      (pVVar1->m_pLogicalDevice).
      super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      __return_storage_ptr__->m_VkObject = pVVar1->m_VkObject;
      pVVar1->m_VkObject = (VkDescriptorPool_T *)0x0;
      VulkanUtilities::SetDescriptorPoolName
                (peVar2->m_VkDevice,__return_storage_ptr__->m_VkObject,DebugName);
      std::
      deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ::pop_front(&this->m_Pools);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

VulkanUtilities::DescriptorPoolWrapper DescriptorPoolManager::GetPool(const char* DebugName)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedPoolCounter;
#endif
    if (m_Pools.empty())
        return CreateDescriptorPool(DebugName);
    else
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_DeviceVkImpl.GetLogicalDevice();
        VulkanUtilities::DescriptorPoolWrapper      Pool          = std::move(m_Pools.front());
        VulkanUtilities::SetDescriptorPoolName(LogicalDevice.GetVkDevice(), Pool, DebugName);
        m_Pools.pop_front();
        return Pool;
    }
}